

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O2

void __thiscall
Rml::ElementText::OnPropertyChange(ElementText *this,PropertyIdSet *changed_properties)

{
  ColourbPremultiplied *this_00;
  float opacity;
  float fVar1;
  Geometry *this_01;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Colour<unsigned_char,_255,_true> rhs;
  uint uVar5;
  Vertex *vertex;
  ComputedValues *pCVar6;
  pointer pVVar7;
  RenderManager *mesh_00;
  undefined1 local_70 [16];
  Mesh mesh;
  
  Element::OnPropertyChange(&this->super_Element,changed_properties);
  pCVar6 = Element::GetComputedValues(&this->super_Element);
  bVar2 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x2c);
  if (bVar2) {
LAB_0029787a:
    opacity = (pCVar6->inherited).opacity;
    fVar1 = this->opacity;
    mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = (pCVar6->inherited).color;
    rhs = Colour<unsigned_char,255,false>::ToPremultiplied<std::integral_constant<bool,false>,void>
                    ((Colour<unsigned_char,255,false> *)&mesh,opacity);
    this_00 = &this->colour;
    bVar2 = Colour<unsigned_char,_255,_true>::operator!=(this_00,rhs);
    if (bVar2) {
      this_00->red = rhs.red;
      this_00->green = rhs.green;
      this_00->blue = rhs.blue;
      this_00->alpha = rhs.alpha;
    }
    if ((fVar1 != opacity) || (NAN(fVar1) || NAN(opacity))) {
      this->opacity = opacity;
      this->font_effects_dirty = true;
      this->field_0x1ec = this->field_0x1ec | 1;
    }
  }
  else {
    bVar2 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x49);
    if (bVar2) goto LAB_0029787a;
    bVar2 = false;
  }
  bVar3 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x2f);
  if (!bVar3) {
    bVar3 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x31);
    if (!bVar3) {
      bVar3 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x30);
      if (!bVar3) {
        bVar3 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x32);
        if (!bVar3) {
          bVar3 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x33);
          if (!bVar3) {
            bVar3 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x60);
            if (!bVar3) {
              bVar3 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x61);
              if (!bVar3) {
                bVar3 = false;
                goto LAB_00297986;
              }
            }
          }
        }
      }
    }
  }
  ::std::
  vector<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>::
  clear(&this->geometry);
  this->field_0x1ec = this->field_0x1ec | 1;
  this->font_effects_handle = 0;
  this->font_effects_dirty = true;
  this->font_handle_version = 0;
  bVar3 = true;
LAB_00297986:
  bVar4 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x4e);
  if (bVar4) {
    this->font_effects_dirty = true;
  }
  bVar4 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x35);
  if (bVar4) {
    uVar5 = *(uint *)&(pCVar6->inherited).field_0x14 >> 0x12;
    this->decoration_property = (TextDecoration)uVar5 & LineThrough;
    if (((this->decoration)._M_t.
         super___uniq_ptr_impl<Rml::Geometry,_std::default_delete<Rml::Geometry>_>._M_t.
         super__Tuple_impl<0UL,_Rml::Geometry_*,_std::default_delete<Rml::Geometry>_>.
         super__Head_base<0UL,_Rml::Geometry_*,_false>._M_head_impl != (Geometry *)0x0) &&
       ((uVar5 & 3) == 0)) {
      ::std::__uniq_ptr_impl<Rml::Geometry,_std::default_delete<Rml::Geometry>_>::reset
                ((__uniq_ptr_impl<Rml::Geometry,_std::default_delete<Rml::Geometry>_> *)
                 &this->decoration,(pointer)0x0);
    }
  }
  if (bVar3) {
    if ((this->field_0x1ec & 2) != 0) {
      Element::DirtyLayout(&this->super_Element);
    }
  }
  else if (bVar2 != false) {
    this->field_0x1ec = this->field_0x1ec | 1;
    this_01 = (this->decoration)._M_t.
              super___uniq_ptr_impl<Rml::Geometry,_std::default_delete<Rml::Geometry>_>._M_t.
              super__Tuple_impl<0UL,_Rml::Geometry_*,_std::default_delete<Rml::Geometry>_>.
              super__Head_base<0UL,_Rml::Geometry_*,_false>._M_head_impl;
    if (this_01 != (Geometry *)0x0) {
      Geometry::Release(&mesh,this_01,ReturnMesh);
      for (pVVar7 = (pointer)CONCAT44(mesh.vertices.
                                      super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      mesh.vertices.
                                      super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                      _M_impl.super__Vector_impl_data._M_start._0_4_);
          pVVar7 != mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pVVar7 = pVVar7 + 1) {
        pVVar7->colour = this->colour;
      }
      mesh_00 = Element::GetRenderManager(&this->super_Element);
      if (mesh_00 != (RenderManager *)0x0) {
        RenderManager::MakeGeometry((RenderManager *)local_70,(Mesh *)mesh_00);
        UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
        ::operator=(&((this->decoration)._M_t.
                      super___uniq_ptr_impl<Rml::Geometry,_std::default_delete<Rml::Geometry>_>._M_t
                      .super__Tuple_impl<0UL,_Rml::Geometry_*,_std::default_delete<Rml::Geometry>_>.
                      super__Head_base<0UL,_Rml::Geometry_*,_false>._M_head_impl)->
                     super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                    ,(UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                      *)local_70);
        UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
        ::~UniqueRenderResource
                  ((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                    *)local_70);
      }
      Mesh::~Mesh(&mesh);
    }
  }
  return;
}

Assistant:

void ElementText::OnPropertyChange(const PropertyIdSet& changed_properties)
{
	RMLUI_ZoneScoped;

	Element::OnPropertyChange(changed_properties);

	bool colour_changed = false;
	bool font_face_changed = false;
	auto& computed = GetComputedValues();

	if (changed_properties.Contains(PropertyId::Color) || changed_properties.Contains(PropertyId::Opacity))
	{
		const float new_opacity = computed.opacity();
		const bool opacity_changed = opacity != new_opacity;

		ColourbPremultiplied new_colour = computed.color().ToPremultiplied(new_opacity);
		colour_changed = colour != new_colour;

		if (colour_changed)
		{
			colour = new_colour;
		}
		if (opacity_changed)
		{
			opacity = new_opacity;
			font_effects_dirty = true;
			geometry_dirty = true;
		}
	}

	if (changed_properties.Contains(PropertyId::FontFamily) ||     //
		changed_properties.Contains(PropertyId::FontWeight) ||     //
		changed_properties.Contains(PropertyId::FontStyle) ||      //
		changed_properties.Contains(PropertyId::FontSize) ||       //
		changed_properties.Contains(PropertyId::LetterSpacing) ||  //
		changed_properties.Contains(PropertyId::RmlUi_Language) || //
		changed_properties.Contains(PropertyId::RmlUi_Direction))
	{
		font_face_changed = true;

		geometry.clear();
		geometry_dirty = true;

		font_effects_handle = 0;
		font_effects_dirty = true;
		font_handle_version = 0;
	}

	if (changed_properties.Contains(PropertyId::FontEffect))
	{
		font_effects_dirty = true;
	}

	if (changed_properties.Contains(PropertyId::TextDecoration))
	{
		decoration_property = computed.text_decoration();
		if (decoration && decoration_property == Style::TextDecoration::None)
			decoration.reset();
	}

	if (font_face_changed)
	{
		// We have to let our document know we need to be regenerated.
		if (dirty_layout_on_change)
			DirtyLayout();
	}
	else if (colour_changed)
	{
		// Force the geometry to be regenerated.
		geometry_dirty = true;

		// Re-colour the decoration geometry.
		if (decoration)
		{
			Mesh mesh = decoration->Release();
			for (Vertex& vertex : mesh.vertices)
				vertex.colour = colour;

			if (RenderManager* render_manager = GetRenderManager())
				*decoration = render_manager->MakeGeometry(std::move(mesh));
		}
	}
}